

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormapper.h
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
irwincolor::Map::map
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,Map *this,
          double y)

{
  string *psVar1;
  float fVar2;
  pointer pdVar3;
  ulong uVar4;
  uchar uVar5;
  byte bVar6;
  int iVar7;
  value_type_conflict3 *__val_1;
  pointer puVar8;
  pointer pdVar9;
  long lVar10;
  pointer pfVar11;
  float *pfVar12;
  uint uVar13;
  value_type_conflict3 *__val_3;
  ulong uVar14;
  uint uVar15;
  value_type_conflict3 *__val_2;
  value_type_conflict *__val;
  float fVar16;
  double dVar17;
  double dVar18;
  vector<float,_std::allocator<float>_> hsv0;
  vector<float,_std::allocator<float>_> hsv1;
  vector<float,_std::allocator<float>_> rgbf;
  double local_d0;
  pointer local_c8;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  vector<float,_std::allocator<float>_> local_78;
  vector<float,_std::allocator<float>_> local_60;
  vector<float,_std::allocator<float>_> local_48;
  
  puVar8 = (pointer)operator_new(3);
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = puVar8;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = puVar8 + 3;
  *puVar8 = '\0';
  puVar8[1] = '\0';
  puVar8[2] = '\0';
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = puVar8 + 3;
  if (y <= 1.0) {
    dVar17 = 0.0;
    if (0.0 <= y) {
      dVar17 = y;
    }
    local_d0 = 1.0;
    if (dVar17 <= 1.0) {
      local_d0 = dVar17;
    }
    if (this->inv != false) {
      local_d0 = 1.0 - local_d0;
    }
    if (this->paraView != true) {
      uVar13 = this->imap;
      if ((ulong)uVar13 < 3) {
        puVar8[uVar13] = (uchar)(int)(local_d0 * 255.99899291992188);
        return __return_storage_ptr__;
      }
      if (uVar13 - 3 < 3) {
        local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT53(local_c0.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start._3_5_,0xffffff);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_assign_aux<unsigned_char_const*>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   &local_c0);
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start[(long)this->imap + -3] =
             (uchar)(int)(local_d0 * 255.99899291992188);
        return __return_storage_ptr__;
      }
      local_d0 = local_d0 * 6.0;
      dVar17 = fmod(local_d0,2.0);
      bVar6 = (byte)(int)((1.0 - ABS(dVar17 + -1.0)) * 255.99899291992188);
      if (local_d0 < 1.0) {
        local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start._0_2_ = CONCAT11(bVar6,0xff);
        local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start._0_3_ =
             (uint3)(ushort)local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_assign_aux<unsigned_char_const*>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   &local_c0);
        return __return_storage_ptr__;
      }
      if (2.0 <= local_d0) {
        if (local_d0 < 3.0) {
          local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start._0_3_ = CONCAT12(bVar6,0xff00);
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_assign_aux<unsigned_char_const*>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     &local_c0);
          return __return_storage_ptr__;
        }
        if (4.0 <= local_d0) {
          if (5.0 <= local_d0) {
            local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start._0_3_ = CONCAT12(bVar6,0xff);
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_assign_aux<unsigned_char_const*>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__
                       ,&local_c0);
            return __return_storage_ptr__;
          }
          local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start._0_3_ = CONCAT21(0xff00,bVar6);
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_assign_aux<unsigned_char_const*>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     &local_c0);
          return __return_storage_ptr__;
        }
        local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start._0_2_ = (ushort)bVar6 << 8;
        local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start._0_3_ =
             CONCAT12(0xff,(ushort)local_c0.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_assign_aux<unsigned_char_const*>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   &local_c0);
        return __return_storage_ptr__;
      }
      local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start._0_3_ = CONCAT21(0xff,bVar6);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 &local_c0);
      return __return_storage_ptr__;
    }
    pdVar3 = (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = pdVar3;
    uVar14 = (long)(this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar3 >> 3;
    while (uVar4 = uVar14, 0 < (long)uVar4) {
      uVar14 = uVar4 >> 1;
      if (pdVar9[uVar14] <= local_d0 && local_d0 != pdVar9[uVar14]) {
        pdVar9 = pdVar9 + uVar14 + 1;
        uVar14 = ~uVar14 + uVar4;
      }
    }
    uVar13 = (uint)((long)pdVar9 - (long)pdVar3 >> 3);
    if (0 < (int)uVar13) {
      uVar15 = uVar13 - 1;
      uVar13 = uVar13 & 0x7fffffff;
      dVar17 = (local_d0 - pdVar3[uVar15]) / (pdVar3[uVar13] - pdVar3[uVar15]);
      psVar1 = &this->space;
      iVar7 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar7 == 0) {
        local_c8 = (pointer)operator_new(0xc);
        local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_c8 + 3;
        local_c8[1] = 0.0;
        local_c8[2] = 0.0;
        *(ulong *)local_c8 =
             CONCAT44((float)(this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar15],
                      (float)(this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar15]);
        local_c8[2] = (float)(this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar15];
        local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = local_c8;
        local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
        pfVar11 = (pointer)operator_new(0xc);
        local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = pfVar11 + 3;
        pfVar11[1] = 0.0;
        pfVar11[2] = 0.0;
        *(ulong *)pfVar11 =
             CONCAT44((float)(this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar13],
                      (float)(this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar13]);
        pfVar11[2] = (float)(this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar13];
        local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = pfVar11;
        local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
        rgb2msh(&local_a8,&local_c0);
        rgb2msh(&local_90,&local_78);
        fVar2 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[2];
        fVar16 = local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[2];
        if (pi < (double)ABS(fVar2 - fVar16)) {
          pfVar12 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (fVar16 < fVar2) {
            pfVar12 = local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          if (fVar2 <= fVar16) {
            fVar16 = fVar2;
          }
          pfVar12[2] = (float)(pi + pi + (double)fVar16);
        }
        pfVar12 = (float *)operator_new(0xc);
        local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = pfVar12 + 3;
        dVar18 = 1.0 - dVar17;
        *pfVar12 = (float)((double)*local_a8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start * dVar18 +
                          (double)*local_90.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start * dVar17);
        pfVar12[1] = (float)((double)local_a8.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start[1] * dVar18 +
                            (double)local_90.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start[1] * dVar17);
        pfVar12[2] = (float)((double)local_a8.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start[2] * dVar18 +
                            (double)local_90.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start[2] * dVar17);
        local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = pfVar12;
        local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
        msh2rgb(&local_60,&local_48);
        *puVar8 = (uchar)(int)(*local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start * 255.999);
        puVar8[1] = (uchar)(int)(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start[1] * 255.999);
        puVar8[2] = (uchar)(int)(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start[2] * 255.999);
        operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
        operator_delete(pfVar12,0xc);
        operator_delete(local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
        uVar14 = (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage -
                 (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar7 == 0) {
          local_c8 = (pointer)operator_new(0xc);
          local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish = local_c8 + 3;
          local_c8[1] = 0.0;
          local_c8[2] = 0.0;
          *(ulong *)local_c8 =
               CONCAT44((float)(this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[uVar15],
                        (float)(this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[uVar15]);
          local_c8[2] = (float)(this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[uVar15];
          local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = local_c8;
          local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage =
               local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          pfVar11 = (pointer)operator_new(0xc);
          local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish = pfVar11 + 3;
          pfVar11[1] = 0.0;
          pfVar11[2] = 0.0;
          *(ulong *)pfVar11 =
               CONCAT44((float)(this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[uVar13],
                        (float)(this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[uVar13]);
          pfVar11[2] = (float)(this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar13];
          local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = pfVar11;
          local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage =
               local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          rgb2lab(&local_a8,&local_c0);
          rgb2lab(&local_90,&local_78);
          pfVar12 = (float *)operator_new(0xc);
          local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish = pfVar12 + 3;
          *pfVar12 = 0.0;
          pfVar12[1] = 0.0;
          pfVar12[2] = 0.0;
          dVar18 = 1.0 - dVar17;
          *pfVar12 = (float)((double)*local_a8.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start * dVar18 +
                            (double)*local_90.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start * dVar17);
          pfVar12[1] = (float)((double)local_a8.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start[1] * dVar18 +
                              (double)local_90.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start[1] * dVar17);
          pfVar12[2] = (float)((double)local_a8.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start[2] * dVar18 +
                              (double)local_90.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start[2] * dVar17);
          local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = pfVar12;
          local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage =
               local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          lab2rgb(&local_60,&local_48);
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)psVar1);
          if (iVar7 != 0) {
            dVar18 = 1.0 - dVar17;
            pdVar3 = (this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *puVar8 = (uchar)(int)((pdVar3[uVar15] * dVar18 + pdVar3[uVar13] * dVar17) *
                                  255.99899291992188);
            pdVar3 = (this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar8[1] = (uchar)(int)((pdVar3[uVar15] * dVar18 + pdVar3[uVar13] * dVar17) *
                                    255.99899291992188);
            pdVar3 = (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar5 = (uchar)(int)((dVar18 * pdVar3[uVar15] + dVar17 * pdVar3[uVar13]) *
                                255.99899291992188);
            goto LAB_0011048e;
          }
          local_c8 = (pointer)operator_new(0xc);
          local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish = local_c8 + 3;
          local_c8[1] = 0.0;
          local_c8[2] = 0.0;
          *(ulong *)local_c8 =
               CONCAT44((float)(this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[uVar15],
                        (float)(this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[uVar15]);
          local_c8[2] = (float)(this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[uVar15];
          local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = local_c8;
          local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage =
               local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          pfVar11 = (pointer)operator_new(0xc);
          local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish = pfVar11 + 3;
          pfVar11[1] = 0.0;
          pfVar11[2] = 0.0;
          *(ulong *)pfVar11 =
               CONCAT44((float)(this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[uVar13],
                        (float)(this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[uVar13]);
          pfVar11[2] = (float)(this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar13];
          local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = pfVar11;
          local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage =
               local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          rgb2hsv(&local_a8,&local_c0);
          rgb2hsv(&local_90,&local_78);
          pfVar12 = (float *)operator_new(0xc);
          local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish = pfVar12 + 3;
          *pfVar12 = 0.0;
          pfVar12[1] = 0.0;
          pfVar12[2] = 0.0;
          dVar18 = 1.0 - dVar17;
          *pfVar12 = (float)((double)*local_a8.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start * dVar18 +
                            (double)*local_90.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start * dVar17);
          pfVar12[1] = (float)((double)local_a8.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start[1] * dVar18 +
                              (double)local_90.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start[1] * dVar17);
          pfVar12[2] = (float)((double)local_a8.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start[2] * dVar18 +
                              (double)local_90.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start[2] * dVar17);
          local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = pfVar12;
          local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage =
               local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          hsv2rgb(&local_60,&local_48);
        }
        *puVar8 = (uchar)(int)(*local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start * 255.999);
        puVar8[1] = (uchar)(int)(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start[1] * 255.999);
        puVar8[2] = (uchar)(int)(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start[2] * 255.999);
        operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
        operator_delete(pfVar12,0xc);
        operator_delete(local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
        uVar14 = (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage -
                 (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
      }
      operator_delete(local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,uVar14);
      operator_delete(pfVar11,0xc);
      operator_delete(local_c8,0xc);
      return __return_storage_ptr__;
    }
    lVar10 = ((long)pdVar9 - (long)pdVar3) * 0x20000000 >> 0x1d;
    *puVar8 = (uchar)(int)(*(double *)
                            ((long)(this->r).super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar10) *
                          255.99899291992188);
    puVar8[1] = (uchar)(int)(*(double *)
                              ((long)(this->g).super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar10) *
                            255.99899291992188);
    dVar17 = *(double *)
              ((long)(this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar10);
  }
  else {
    *puVar8 = (uchar)(int)(this->nanr * 255.99899291992188);
    puVar8[1] = (uchar)(int)(this->nang * 255.99899291992188);
    dVar17 = this->nanb;
  }
  uVar5 = (uchar)(int)(dVar17 * 255.99899291992188);
LAB_0011048e:
  puVar8[2] = uVar5;
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> map(double y) const
	{
		// "const" after the function name here means that this
		// method does not modify the class.

		// Almost, we need to floor result
		const float twofivesix = 255.999;

		// Map y in range [0, 1] (clipped if outside) to an RGB triple
		// in range [0, 255].

		std::vector<uint8_t> rgb(3);

		// Map out-of-range values to NaN color.
		if (y > 1.0)
		{
			rgb[0] = twofivesix * nanr;
			rgb[1] = twofivesix * nang;
			rgb[2] = twofivesix * nanb;
			return rgb;
		}

		y = std::min(std::max(y, 0.0), 1.0);

		if (inv)
			y = 1 - y;

		//// Note, using a function like sqrt here can skew the map
		//// towards the 255 end of the spectrum, while squaring can shift
		//// towards 0.
		//
		// TODO:  make an option for the exponent here.  It's useful for
		// things like black-to-red where the bright reds are
		// imperceptibly different from one another and a larger
		// exponent (e.g. 3 or 4) is helpful, while for HSV 1 is OK.
		//
		//y = sqrt(y);
		//y = y * y * y * y;
		if (paraView)
		{
			auto iter = std::lower_bound(x.begin(), x.end(), y);  // binary search
			int i = std::distance(x.begin(), iter);
			//std::cout << "i = " << i << "\n";
			//std::cout << "y = " << y << "\n";
			//std::cout << "iter = " << *iter << "\n";
			if (i > 0)
			{
				double f = (y - x[i-1]) / (x[i] - x[i-1]);
				if (space == "Diverging")
				{
					// TODO:  this may not be 100% correct, it's hard to
					// tell.  The adjustHue function described in the
					// reference may be required.  But there's only one
					// colormap in my XML files that uses this space
					// anyway.

					std::vector<float> rgb0(3);
					rgb0[0] = r[i-1];
					rgb0[1] = g[i-1];
					rgb0[2] = b[i-1];

					std::vector<float> rgb1(3);
					rgb1[0] = r[i];
					rgb1[1] = g[i];
					rgb1[2] = b[i];

					auto msh0 = rgb2msh(rgb0);
					auto msh1 = rgb2msh(rgb1);

					// Interpolating between an angle close to
					// +pi and an angle close to -pi should not
					// give a result near zero.
					if (abs(msh1[2] - msh0[2]) > pi)
					{
						if (msh0[2] < msh1[2])
							msh0[2] += 2 * pi;
						else
							msh1[2] += 2 * pi;
					}

					std::vector<float> msh(3);
					msh[0] = (1.0 - f) * msh0[0] + f * msh1[0];
					msh[1] = (1.0 - f) * msh0[1] + f * msh1[1];
					msh[2] = (1.0 - f) * msh0[2] + f * msh1[2];

					auto rgbf = msh2rgb(msh);

					rgb[0] = twofivesix * rgbf[0];
					rgb[1] = twofivesix * rgbf[1];
					rgb[2] = twofivesix * rgbf[2];

					////auto xyz0 = rgb2xyz(rgb0);
					////auto xyz  = msh2xyz(msh);
					////auto xyz1 = rgb2xyz(rgb1);
					//std::cout << "rgb0 = " << rgb0 << std::endl;
					//std::cout << "rgb  = " << (int) rgb[0] << " " << (int) rgb[1] << " " << (int) rgb[2] << std::endl;
					//std::cout << "rgbf = " << rgbf << std::endl;
					//std::cout << "rgb1 = " << rgb1 << std::endl;
					//std::cout << "msh0 = " << msh0 << std::endl;
					//std::cout << "msh  = " << msh  << std::endl;
					//std::cout << "msh1 = " << msh1 << std::endl;
					////std::cout << "xyz0 = " << xyz0 << std::endl;
					////std::cout << "xyz  = " << xyz  << std::endl;
					////std::cout << "xyz1 = " << xyz1 << std::endl;
					//std::cout << std::endl;
				}
				else if (space == "Lab")
				{
					std::vector<float> rgb0(3);
					rgb0[0] = r[i-1];
					rgb0[1] = g[i-1];
					rgb0[2] = b[i-1];

					std::vector<float> rgb1(3);
					rgb1[0] = r[i];
					rgb1[1] = g[i];
					rgb1[2] = b[i];

					auto lab0 = rgb2lab(rgb0);
					auto lab1 = rgb2lab(rgb1);

					std::vector<float> lab(3);
					lab[0] = (1.0 - f) * lab0[0] + f * lab1[0];
					lab[1] = (1.0 - f) * lab0[1] + f * lab1[1];
					lab[2] = (1.0 - f) * lab0[2] + f * lab1[2];

					auto rgbf = lab2rgb(lab);

					rgb[0] = twofivesix * rgbf[0];
					rgb[1] = twofivesix * rgbf[1];
					rgb[2] = twofivesix * rgbf[2];

					//auto xyz0 = rgb2xyz(rgb0);
					//auto xyz  = lab2xyz(lab);
					//auto xyz1 = rgb2xyz(rgb1);
					//std::cout << "rgb0 = " << rgb0 << std::endl;
					//std::cout << "rgb  = " << (int) rgb[0] << " " << (int) rgb[1] << " " << (int) rgb[2] << std::endl;
					//std::cout << "rgbf = " << rgbf << std::endl;
					//std::cout << "rgb1 = " << rgb1 << std::endl;
					//std::cout << "lab0 = " << lab0 << std::endl;
					//std::cout << "lab  = " << lab  << std::endl;
					//std::cout << "lab1 = " << lab1 << std::endl;
					//std::cout << "xyz0 = " << xyz0 << std::endl;
					//std::cout << "xyz  = " << xyz  << std::endl;
					//std::cout << "xyz1 = " << xyz1 << std::endl;
					//std::cout << std::endl;
				}
				else if (space == "HSV")
				{
					std::vector<float> rgb0(3);
					rgb0[0] = r[i-1];
					rgb0[1] = g[i-1];
					rgb0[2] = b[i-1];

					std::vector<float> rgb1(3);
					rgb1[0] = r[i];
					rgb1[1] = g[i];
					rgb1[2] = b[i];

					auto hsv0 = rgb2hsv(rgb0);
					auto hsv1 = rgb2hsv(rgb1);

					std::vector<float> hsv(3);
					hsv[0] = (1.0 - f) * hsv0[0] + f * hsv1[0];
					hsv[1] = (1.0 - f) * hsv0[1] + f * hsv1[1];
					hsv[2] = (1.0 - f) * hsv0[2] + f * hsv1[2];

					auto rgbf = hsv2rgb(hsv);

					rgb[0] = twofivesix * rgbf[0];
					rgb[1] = twofivesix * rgbf[1];
					rgb[2] = twofivesix * rgbf[2];
				}
				else  // RGB
				{
					// TODO:  add a warning for unrecognized color spaces.
					rgb[0] = twofivesix * ((1.0 - f) * r[i-1] + f * r[i]);
					rgb[1] = twofivesix * ((1.0 - f) * g[i-1] + f * g[i]);
					rgb[2] = twofivesix * ((1.0 - f) * b[i-1] + f * b[i]);
				}
			}
			else
			{
				rgb[0] = twofivesix * r[i];
				rgb[1] = twofivesix * g[i];
				rgb[2] = twofivesix * b[i];
			}
		}
		else if (0 <= imap && imap < 3)
		{
			// Black-to-(red|green|blue) map
			//            0    1     2
			rgb[imap] = y * twofivesix;
		}
		else if (3 <= imap && imap < 6)
		{
			// (cyan|magenta|yellow)-to-white map
			//    3     4       5
			rgb = {twofivefive, twofivefive, twofivefive};
			rgb[imap - 3] = y * twofivesix;
		}
		else
		{
			// HSV
			uint8_t c = twofivefive;
			double hp = 6.0 * y;
			uint8_t xu = twofivesix * (1.0 - abs(fmod(hp, 2.0) - 1.0));
			if (hp < 1.0)
				rgb = {c, xu, 0};
			else if (hp < 2.0)
				rgb = {xu, c, 0};
			else if (hp < 3.0)
				rgb = {0, c, xu};
			else if (hp < 4.0)
				rgb = {0, xu, c};
			else if (hp < 5.0)
				rgb = {xu, 0, c};
			else
				rgb = {c, 0, xu};
		}

		//std::cout << "y = " << y << "\n";
		//std::cout << "rgb = " << rgb << "\n";

		return rgb;
	}